

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolution_pack4to1.h
# Opt level: O0

void ncnn::deconvolution_pack4to1_sse
               (Mat *bottom_blob,Mat *top_blob,Mat *weight_data_packed,Mat *bias_data,int kernel_w,
               int kernel_h,int dilation_w,int dilation_h,int stride_w,int stride_h,
               int activation_type,Mat *activation_params,Option *opt)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  undefined8 uVar4;
  undefined8 uVar5;
  int iVar6;
  int iVar7;
  float *pfVar8;
  long *in_RCX;
  long *in_RDX;
  long *in_RSI;
  long *in_RDI;
  int in_R8D;
  int in_R9D;
  double dVar9;
  undefined1 auVar10 [16];
  int in_stack_00000008;
  int in_stack_00000010;
  int in_stack_00000018;
  int in_stack_00000020;
  undefined4 in_stack_00000028;
  long *in_stack_00000030;
  __m128 _w;
  __m128 _val;
  int k;
  float *sptr;
  int sx;
  int sxs;
  int x;
  int sy;
  int sys;
  int y;
  Mat m_2;
  int q;
  float *kptr;
  __m128 _sum;
  float sum;
  int j;
  int i;
  int outh;
  int outw;
  int channels;
  int h;
  int w;
  int maxk;
  float *outptr;
  int p;
  float *bias_data_ptr;
  int kernel_extent_h;
  int kernel_extent_w;
  int outch;
  Mat *m;
  Mat *m_3;
  Mat *m_1;
  float upper;
  float lower;
  float beta;
  float alpha;
  float max;
  float min;
  float slope;
  __m128 x32;
  __m128 x64;
  float local_68c;
  int local_5b8;
  int local_5ac;
  undefined8 local_5a8;
  undefined8 local_5a0;
  undefined8 local_598;
  undefined4 local_590;
  long local_588;
  undefined4 local_580;
  undefined4 local_57c;
  undefined4 local_578;
  undefined4 local_574;
  undefined4 local_570;
  undefined8 local_568;
  int local_55c;
  undefined8 local_558;
  undefined8 local_550;
  undefined8 local_548;
  undefined4 local_540;
  long local_538;
  undefined4 local_530;
  undefined4 local_52c;
  undefined4 local_528;
  undefined4 local_524;
  undefined4 local_520;
  undefined8 local_518;
  long local_510;
  undefined8 local_508;
  undefined8 uStack_500;
  float local_4f0;
  int local_4ec;
  int local_4e8;
  int local_4e4;
  int local_4e0;
  int local_4dc;
  int local_4d8;
  int local_4d4;
  int local_4d0;
  undefined8 local_4c0;
  undefined8 local_4b8;
  undefined8 local_4b0;
  undefined4 local_4a8;
  long local_4a0;
  undefined4 local_498;
  undefined4 local_494;
  undefined4 local_490;
  undefined4 local_48c;
  undefined4 local_488;
  undefined8 local_480;
  float *local_478;
  int local_46c;
  long local_468;
  int local_45c;
  int local_458;
  int local_454;
  int local_450;
  int local_44c;
  long *local_440;
  long *local_438;
  long *local_430;
  undefined8 *local_428;
  undefined1 local_41d;
  int local_41c;
  undefined8 *local_410;
  undefined8 *local_400;
  undefined8 *local_3f0;
  undefined8 *local_3e0;
  undefined8 *local_3b8;
  undefined8 *local_398;
  undefined8 *local_378;
  undefined1 local_35d;
  int local_35c;
  undefined8 *local_350;
  undefined1 local_32d;
  int local_32c;
  undefined8 *local_320;
  undefined8 *local_300;
  int local_2ec;
  undefined8 *local_2e8;
  float local_2dc;
  float local_2d8;
  float local_2d4;
  float local_2d0;
  float local_2cc;
  float local_2c8;
  float local_2c4;
  float local_2c0;
  float local_2bc;
  long *local_2b8;
  float local_2ac [3];
  long *local_2a0;
  undefined8 local_298;
  long *local_290;
  undefined8 local_288;
  long *local_280;
  undefined8 local_278;
  long *local_270;
  undefined8 local_268;
  long *local_260;
  long local_258;
  undefined4 local_24c;
  long local_248;
  long local_240;
  undefined4 local_234;
  int local_230;
  int local_22c;
  undefined8 *local_228;
  long local_220;
  undefined4 local_214;
  long local_210;
  long local_208;
  undefined4 local_1fc;
  int local_1f8;
  int local_1f4;
  undefined8 *local_1f0;
  long local_1e8;
  undefined4 local_1dc;
  long local_1d8;
  float *local_1d0;
  undefined4 local_1c4;
  int local_1c0;
  int local_1bc;
  undefined8 *local_1b8;
  undefined4 local_1ac;
  long local_1a8;
  undefined4 local_19c;
  long local_198;
  undefined4 local_18c;
  long local_188;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 *local_128;
  undefined1 (*local_120) [16];
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined1 local_f8 [16];
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined1 local_d8 [16];
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  ulong local_a8;
  undefined8 uStack_a0;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined1 local_78 [8];
  float fStack_70;
  float fStack_6c;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  float local_38;
  float fStack_34;
  float fStack_30;
  float fStack_2c;
  undefined1 local_28 [16];
  ulong local_18;
  undefined8 uStack_10;
  
  local_454 = (int)in_RSI[7];
  local_458 = in_stack_00000008 * (in_R8D + -1) + 1;
  local_45c = in_stack_00000010 * (in_R9D + -1) + 1;
  local_468 = *in_RCX;
  local_450 = in_R9D;
  local_44c = in_R8D;
  local_440 = in_RDX;
  local_438 = in_RSI;
  local_430 = in_RDI;
  for (local_46c = 0; local_46c < local_454; local_46c = local_46c + 1) {
    local_410 = &local_4c0;
    local_1bc = *(int *)((long)local_438 + 0x2c);
    local_1c0 = (int)local_438[6];
    local_1c4 = *(undefined4 *)((long)local_438 + 0x34);
    local_478 = (float *)(*local_438 + local_438[8] * (long)local_46c * local_438[2]);
    local_1d8 = local_438[2];
    local_1dc = (undefined4)local_438[3];
    local_1e8 = local_438[4];
    local_1b8 = &local_4c0;
    local_1a8 = (long)local_1bc * (long)local_1c0 * local_1d8;
    local_428 = &local_4c0;
    local_400 = &local_4c0;
    local_1ac = 0x10;
    local_41c = local_46c;
    local_41d = 1;
    local_4c0 = 0;
    local_4b0 = 0;
    local_4a8 = 0;
    local_498 = 0;
    local_494 = 0;
    local_490 = 0;
    local_48c = 0;
    local_488 = 0;
    local_480 = 0;
    local_4b8 = 0;
    local_4d0 = local_44c * local_450;
    local_4d4 = *(int *)((long)local_430 + 0x2c);
    local_4d8 = (int)local_430[6];
    local_4dc = (int)local_430[7];
    local_4e0 = *(int *)((long)local_438 + 0x2c);
    local_4e4 = (int)local_438[6];
    local_378 = local_400;
    local_1d0 = local_478;
    local_4a0 = local_1e8;
    for (local_4e8 = 0; local_4e8 < local_4e4; local_4e8 = local_4e8 + 1) {
      for (local_4ec = 0; local_4ec < local_4e0; local_4ec = local_4ec + 1) {
        local_4f0 = 0.0;
        if (local_468 != 0) {
          local_4f0 = *(float *)(local_468 + (long)local_46c * 4);
        }
        local_320 = &local_558;
        local_22c = *(int *)((long)local_440 + 0x2c);
        local_230 = (int)local_440[6];
        local_234 = *(undefined4 *)((long)local_440 + 0x34);
        local_240 = *local_440 + local_440[8] * (long)local_46c * local_440[2];
        local_248 = local_440[2];
        local_24c = (undefined4)local_440[3];
        local_258 = local_440[4];
        local_228 = &local_558;
        local_188 = (long)local_22c * (long)local_230 * local_248;
        local_300 = &local_558;
        local_3f0 = &local_558;
        uStack_130 = 0;
        local_138 = 0;
        local_18c = 0x10;
        local_32c = local_46c;
        local_32d = 1;
        uStack_500 = 0;
        local_508 = 0;
        local_558 = 0;
        local_548 = 0;
        local_540 = 0;
        local_530 = 0;
        local_52c = 0;
        local_528 = 0;
        local_524 = 0;
        local_520 = 0;
        local_518 = 0;
        local_550 = 0;
        local_510 = local_240;
        for (local_55c = 0; local_55c < local_4dc; local_55c = local_55c + 1) {
          local_350 = &local_5a8;
          local_1f4 = *(int *)((long)local_430 + 0x2c);
          local_1f8 = (int)local_430[6];
          local_1fc = *(undefined4 *)((long)local_430 + 0x34);
          local_208 = *local_430 + local_430[8] * (long)local_55c * local_430[2];
          local_210 = local_430[2];
          local_214 = (undefined4)local_430[3];
          local_220 = local_430[4];
          local_1f0 = &local_5a8;
          local_198 = (long)local_1f4 * (long)local_1f8 * local_210;
          for (local_5ac = 0; local_5ac < local_450; local_5ac = local_5ac + 1) {
            iVar6 = (local_4e8 + local_5ac * in_stack_00000010) - (local_45c + -1);
            if (((-1 < iVar6) && (iVar6 % in_stack_00000020 == 0)) &&
               (iVar6 = iVar6 / in_stack_00000020, iVar6 < local_4d8)) {
              for (local_5b8 = 0; local_5b8 < local_44c; local_5b8 = local_5b8 + 1) {
                iVar7 = (local_4ec + local_5b8 * in_stack_00000008) - (local_458 + -1);
                if (((-1 < iVar7) && (iVar7 % in_stack_00000018 == 0)) &&
                   (iVar7 / in_stack_00000018 < local_4d4)) {
                  local_2e8 = &local_5a8;
                  local_120 = (undefined1 (*) [16])
                              (local_208 + (long)local_1f4 * (long)iVar6 * local_210 +
                              (long)(iVar7 / in_stack_00000018 << 2) * 4);
                  uVar1 = *(undefined8 *)*local_120;
                  uVar2 = *(undefined8 *)(*local_120 + 8);
                  local_f8 = *local_120;
                  local_128 = (undefined8 *)
                              (local_510 + (long)((local_5ac * local_44c + local_5b8) * 4) * 4);
                  local_108 = *local_128;
                  uStack_100 = local_128[1];
                  local_118 = local_508;
                  uStack_110 = uStack_500;
                  local_b8._0_4_ = (float)uVar1;
                  local_b8._4_4_ = (float)((ulong)uVar1 >> 0x20);
                  uStack_b0._0_4_ = (float)uVar2;
                  uStack_b0._4_4_ = (float)((ulong)uVar2 >> 0x20);
                  local_c8._0_4_ = (float)local_108;
                  local_c8._4_4_ = (float)((ulong)local_108 >> 0x20);
                  uStack_c0._0_4_ = (float)uStack_100;
                  uStack_c0._4_4_ = (float)((ulong)uStack_100 >> 0x20);
                  local_d8._0_4_ = (float)local_b8 * (float)local_c8;
                  local_d8._4_4_ = local_b8._4_4_ * local_c8._4_4_;
                  local_d8._8_4_ = (float)uStack_b0 * (float)uStack_c0;
                  local_d8._12_4_ = uStack_b0._4_4_ * uStack_c0._4_4_;
                  local_e8 = local_508;
                  uVar4 = local_e8;
                  uStack_e0 = uStack_500;
                  uVar5 = uStack_e0;
                  local_e8._0_4_ = (float)local_508;
                  local_e8._4_4_ = (float)((ulong)local_508 >> 0x20);
                  uStack_e0._0_4_ = (float)uStack_500;
                  uStack_e0._4_4_ = (float)((ulong)uStack_500 >> 0x20);
                  local_508 = CONCAT44(local_d8._4_4_ + local_e8._4_4_,
                                       local_d8._0_4_ + (float)local_e8);
                  uStack_500 = CONCAT44(local_d8._12_4_ + uStack_e0._4_4_,
                                        local_d8._8_4_ + (float)uStack_e0);
                  local_2ec = iVar6;
                  local_e8 = uVar4;
                  uStack_e0 = uVar5;
                  local_c8 = local_108;
                  uStack_c0 = uStack_100;
                  local_b8 = uVar1;
                  uStack_b0 = uVar2;
                }
              }
            }
          }
          local_510 = local_510 + (long)(local_4d0 << 2) * 4;
          local_3e0 = &local_5a8;
          local_19c = 0x10;
          local_35c = local_55c;
          local_35d = 1;
          local_5a8 = 0;
          local_598 = 0;
          local_590 = 0;
          local_580 = 0;
          local_57c = 0;
          local_578 = 0;
          local_574 = 0;
          local_570 = 0;
          local_568 = 0;
          local_5a0 = 0;
          local_3b8 = local_3e0;
          local_588 = local_220;
        }
        local_88 = local_508;
        uStack_80 = uStack_500;
        local_48 = local_508;
        uStack_40 = uStack_500;
        local_58 = local_508;
        uStack_50 = uStack_500;
        auVar3._8_8_ = uStack_500;
        auVar3._0_8_ = local_508;
        auVar10._8_8_ = uStack_500;
        auVar10._0_8_ = local_508;
        _local_78 = vunpckhpd_avx(auVar10,auVar3);
        local_68 = local_508;
        uVar1 = local_68;
        uStack_60 = uStack_500;
        uVar2 = uStack_60;
        local_68._0_4_ = (float)local_508;
        local_68._4_4_ = (float)((ulong)local_508 >> 0x20);
        uStack_60._0_4_ = (float)uStack_500;
        uStack_60._4_4_ = (float)((ulong)uStack_500 >> 0x20);
        local_98 = (float)local_68 + (float)local_78._0_4_;
        fStack_94 = local_68._4_4_ + (float)local_78._4_4_;
        fStack_90 = (float)uStack_60 + fStack_70;
        fStack_8c = uStack_60._4_4_ + fStack_6c;
        local_28._0_4_ = local_98 + fStack_94;
        auVar10 = ZEXT416((uint)local_28._0_4_);
        local_28._4_4_ = 0;
        local_a8 = local_28._0_8_;
        uStack_a0 = 0;
        local_18 = local_28._0_8_;
        uStack_10 = 0;
        local_68c = local_4f0 + (float)local_28._0_4_;
        local_2b8 = in_stack_00000030;
        local_2ac[0] = local_68c;
        local_4f0 = local_68c;
        local_398 = local_3f0;
        local_68 = uVar1;
        uStack_60 = uVar2;
        local_38 = fStack_94;
        fStack_34 = fStack_94;
        fStack_30 = fStack_94;
        fStack_2c = fStack_94;
        local_28 = auVar10;
        local_538 = local_258;
        switch(in_stack_00000028) {
        case 1:
          dVar9 = std::fmax((double)(ulong)(uint)local_68c,0.0);
          local_2ac[0] = SUB84(dVar9,0);
          break;
        case 2:
          local_260 = in_stack_00000030;
          local_268 = 0;
          local_2bc = *(float *)*in_stack_00000030;
          if (local_68c <= 0.0) {
            local_68c = local_68c * local_2bc;
          }
          local_2ac[0] = local_68c;
          break;
        case 3:
          local_270 = in_stack_00000030;
          local_278 = 0;
          local_2c0 = *(float *)*in_stack_00000030;
          local_280 = in_stack_00000030;
          local_288 = 1;
          local_2c4 = *(float *)(*in_stack_00000030 + 4);
          if (local_68c < local_2c0) {
            local_2ac[0] = local_2c0;
          }
          if (local_2c4 < local_2ac[0]) {
            local_2ac[0] = local_2c4;
          }
          break;
        case 4:
          local_2c8 = 88.37626;
          pfVar8 = std::min<float>(local_2ac,&local_2c8);
          local_2ac[0] = *pfVar8;
          local_2cc = -88.37626;
          pfVar8 = std::max<float>(local_2ac,&local_2cc);
          local_2ac[0] = *pfVar8;
          dVar9 = std::exp((double)(ulong)(uint)-local_2ac[0]);
          local_2ac[0] = 1.0 / (SUB84(dVar9,0) + 1.0);
          break;
        case 5:
          dVar9 = std::exp((double)(ulong)(uint)local_68c);
          dVar9 = std::log((double)(ulong)(uint)(SUB84(dVar9,0) + 1.0));
          dVar9 = std::tanh(dVar9);
          local_2ac[0] = local_68c * SUB84(dVar9,0);
          break;
        case 6:
          local_290 = in_stack_00000030;
          local_298 = 0;
          local_2d0 = *(float *)*in_stack_00000030;
          local_2a0 = in_stack_00000030;
          local_2ac[1] = 1.4013e-45;
          local_2ac[2] = 0.0;
          local_2d4 = *(float *)(*in_stack_00000030 + 4);
          local_2d8 = -local_2d4 / local_2d0;
          local_2dc = 1.0 / local_2d0 + local_2d8;
          if (local_2d8 <= local_68c) {
            if (local_68c <= local_2dc) {
              local_2ac[0] = local_68c * (local_68c * local_2d0 + local_2d4);
            }
          }
          else {
            local_2ac[0] = 0.0;
          }
        }
        *local_478 = local_2ac[0];
        local_478 = local_478 + 1;
      }
    }
  }
  return;
}

Assistant:

static void deconvolution_pack4to1_sse(const Mat& bottom_blob, Mat& top_blob, const Mat& weight_data_packed, const Mat& bias_data, int kernel_w, int kernel_h, int dilation_w, int dilation_h, int stride_w, int stride_h, int activation_type, const Mat& activation_params, const Option& opt)
{
    int outch = top_blob.c;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    const float* bias_data_ptr = bias_data;

    // num_output
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        float* outptr = top_blob.channel(p);

        const int maxk = kernel_w * kernel_h;

        // shadowed variable for less openmp task args
        const int w = bottom_blob.w;
        const int h = bottom_blob.h;
        const int channels = bottom_blob.c;
        const int outw = top_blob.w;
        const int outh = top_blob.h;

        for (int i = 0; i < outh; i++)
        {
            for (int j = 0; j < outw; j++)
            {
                float sum = 0.f;

                if (bias_data_ptr)
                {
                    sum = bias_data_ptr[p];
                }

                __m128 _sum = _mm_setzero_ps();

                const float* kptr = weight_data_packed.channel(p);

                // channels
                for (int q = 0; q < channels; q++)
                {
                    const Mat m = bottom_blob.channel(q);

                    for (int y = 0; y < kernel_h; y++)
                    {
                        int sys = (i + y * dilation_h - (kernel_extent_h - 1));
                        if (sys < 0 || sys % stride_h != 0)
                            continue;

                        int sy = sys / stride_h;
                        if (sy >= h)
                            continue;

                        for (int x = 0; x < kernel_w; x++)
                        {
                            int sxs = (j + x * dilation_w - (kernel_extent_w - 1));
                            if (sxs < 0 || sxs % stride_w != 0)
                                continue;

                            int sx = sxs / stride_w;
                            if (sx >= w)
                                continue;

                            const float* sptr = m.row(sy) + sx * 4;

                            int k = y * kernel_w + x;

                            __m128 _val = _mm_load_ps(sptr);
                            __m128 _w = _mm_load_ps(kptr + k * 4);
                            _sum = _mm_comp_fmadd_ps(_val, _w, _sum);
                        }
                    }

                    kptr += maxk * 4;
                }

                sum += _mm_reduce_add_ps(_sum);

                sum = activation_ss(sum, activation_type, activation_params);

                outptr[0] = sum;
                outptr++;
            }
        }
    }
}